

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O2

void quantize_1(float *src,void *dst,int n,int k)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  int b;
  long lVar4;
  ulong uVar5;
  int l;
  long lVar6;
  ulong uVar7;
  float *pfVar8;
  float *pfVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float min;
  float fVar14;
  float fVar15;
  ulong local_58 [5];
  uint64_t pp [4];
  
  uVar3 = 0;
  uVar1 = (long)k / 0x40 & 0xffffffff;
  if ((int)((long)k / 0x40) < 1) {
    uVar1 = uVar3;
  }
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar3;
  }
  pfVar8 = src;
  for (uVar11 = 0; uVar11 != uVar5; uVar11 = uVar11 + 1) {
    pfVar9 = pfVar8;
    for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
      auVar13 = SUB6416(ZEXT464(0xff7fffff),0);
      auVar12 = SUB6416(ZEXT464(0x7f7fffff),0);
      for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
        auVar12 = vminss_avx(ZEXT416((uint)pfVar9[lVar6]),auVar12);
        auVar13 = vmaxss_avx(ZEXT416((uint)pfVar9[lVar6]),auVar13);
      }
      fVar14 = auVar12._0_4_;
      fVar15 = (auVar13._0_4_ - fVar14) / 15.0;
      auVar13 = vcmpss_avx(ZEXT416((uint)fVar15),ZEXT816(0) << 0x40,4);
      auVar13 = vandps_avx(auVar13,ZEXT416((uint)(1.0 / fVar15)));
      *(float *)dst = fVar14;
      *(float *)((long)dst + 4) = fVar15;
      dst = (void *)((long)dst + 8);
      bVar2 = true;
      while (bVar2) {
        local_58[0] = 0;
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
        for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
          fVar15 = src[uVar10 * 0x40 + uVar11 * (long)k + lVar6];
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            uVar7 = 1L << ((byte)lVar6 & 0x3f);
            if ((((int)((fVar15 - fVar14) * auVar13._0_4_) & 0xffU) >> ((uint)lVar4 & 0x1f) & 1) ==
                0) {
              uVar7 = uVar3;
            }
            local_58[lVar4] = local_58[lVar4] | uVar7;
          }
        }
        for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
          *(undefined8 *)((long)dst + lVar6) = *(undefined8 *)((long)local_58 + lVar6);
        }
        dst = (void *)((long)dst + 0x20);
        bVar2 = false;
      }
      pfVar9 = pfVar9 + 0x40;
    }
    pfVar8 = pfVar8 + k;
  }
  return;
}

Assistant:

void quantize_1(const float * src, void * dst, int n, int k) {
    char * p0 = dst;

    gq_quant_t pp[QB];

    for (int j = 0; j < n; j++) {
        for (int i = 0; i < k/QK; i++) {
            float min = FLT_MAX;
            float max = -FLT_MAX;

            // find min/max
#ifdef __ARM_NEON
            {
                float32x4_t minv = vdupq_n_f32(FLT_MAX);
                float32x4_t maxv = vdupq_n_f32(-FLT_MAX);

                for (int l = 0; l < QK; l += 4) {
                    float32x4_t v = vld1q_f32(src + j*k + i*QK + l);
                    minv = vminq_f32(minv, v);
                    maxv = vmaxq_f32(maxv, v);
                }

                float32x2_t minv32 = vpmin_f32(vget_low_f32(minv), vget_high_f32(minv));
                float32x2_t maxv32 = vpmax_f32(vget_low_f32(maxv), vget_high_f32(maxv));

                min = MIN(vget_lane_f32(minv32, 0), vget_lane_f32(minv32, 1));
                max = MAX(vget_lane_f32(maxv32, 0), vget_lane_f32(maxv32, 1));

                //printf("SIMD min/max: %f %f\n", min, max);
            }
#else
            {
                for (int l = 0; l < QK; l++) {
                    const float v = src[j*k + i*QK + l];
                    if (v < min) min = v;
                    if (v > max) max = v;
                }

                //printf("NORM min/max: %f %f\n", min, max);
            }
#endif

            const float d = (max - min) / ((1 << QB) - 1);
            const float id = d ? 1.0/d : 0.0;

            memcpy(p0, &min, sizeof(float)); p0 += sizeof(float);
            memcpy(p0, &d,   sizeof(float)); p0 += sizeof(float);

            //printf("min/max/d/id: %f %f %f %f\n", min, max, d, id);

            for (int s = 0; s < QK/gq_t_bits; ++s) {
                memset(pp, 0, sizeof(pp));

                for (int l = 0; l < gq_t_bits; l++) {
                    const   float v = src[j*k + i*QK + s*gq_t_bits + l];
                    const uint8_t q = (v - min)*id;

                    for (int b = 0; b < QB; b++) {
                        pp[b] |= q & (1 << b) ? (1ULL << l) : 0;
                    }
                }

                for (int b = 0; b < QB; b++) {
                    memcpy(p0, &pp[b], sizeof(gq_quant_t)); p0 += sizeof(gq_quant_t);
                }
            }
        }
    }
}